

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopupEx(ImGuiID id,ImGuiWindowFlags extra_flags)

{
  int iVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ulong uVar4;
  ImGuiContext *g;
  char *fmt;
  char name [20];
  char acStack_28 [32];
  
  iVar1 = (GImGui->BeginPopupStack).Size;
  uVar4 = (ulong)iVar1;
  if ((iVar1 < (GImGui->OpenPopupStack).Size) &&
     ((GImGui->OpenPopupStack).Data[uVar4].PopupId == id)) {
    if (((uint)extra_flags >> 0x1c & 1) == 0) {
      fmt = "##Popup_%08x";
      uVar4 = (ulong)id;
    }
    else {
      fmt = "##Menu_%02d";
    }
    ImFormatString(acStack_28,0x14,fmt,uVar4);
    bVar3 = Begin(acStack_28,(bool *)0x0,extra_flags | 0x4000000);
    if (!bVar3) {
      NavMoveRequestTryWrapping(GImGui->CurrentWindow,2);
      End();
    }
  }
  else {
    pIVar2 = GImGui;
    (pIVar2->NextWindowData).CollapsedCond = 0;
    (pIVar2->NextWindowData).SizeConstraintCond = 0;
    (pIVar2->NextWindowData).FocusCond = 0;
    (pIVar2->NextWindowData).BgAlphaCond = 0;
    (pIVar2->NextWindowData).PosCond = 0;
    (pIVar2->NextWindowData).SizeCond = 0;
    (pIVar2->NextWindowData).ContentSizeCond = 0;
    (pIVar2->NextWindowData).CollapsedCond = 0;
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::BeginPopupEx(ImGuiID id, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    if (!IsPopupOpen(id))
    {
        g.NextWindowData.Clear(); // We behave like Begin() and need to consume those values
        return false;
    }

    char name[20];
    if (extra_flags & ImGuiWindowFlags_ChildMenu)
        ImFormatString(name, IM_ARRAYSIZE(name), "##Menu_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth
    else
        ImFormatString(name, IM_ARRAYSIZE(name), "##Popup_%08x", id); // Not recycling, so we can close/open during the same frame

    bool is_open = Begin(name, NULL, extra_flags | ImGuiWindowFlags_Popup);
    if (!is_open) // NB: Begin can return false when the popup is completely clipped (e.g. zero size display)
        EndPopup();

    return is_open;
}